

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O1

void __thiscall n_e_s::core::Ppu::increase_scroll_counters(Ppu *this)

{
  PpuRegisters *pPVar1;
  ushort uVar2;
  
  pPVar1 = this->registers_;
  if (((pPVar1->mask).super_Register<unsigned_char>.value_ & 0x18) != 0) {
    if ((pPVar1->scanline == 0x105) && ((ushort)(pPVar1->cycle - 0x118) < 0x19)) {
      (pPVar1->vram_addr).super_Register<unsigned_short>.value_ =
           (pPVar1->temp_vram_addr).super_Register<unsigned_short>.value_ & 0x7be0 |
           (pPVar1->vram_addr).super_Register<unsigned_short>.value_ & 0x841f;
    }
    pPVar1 = this->registers_;
    uVar2 = pPVar1->cycle;
    if ((uVar2 != 0) && ((uVar2 & 7) == 0 && (ushort)(uVar2 - 0x141) < 0xffbf)) {
      uVar2 = (pPVar1->vram_addr).super_Register<unsigned_short>.value_;
      if ((~uVar2 & 0x1f) == 0) {
        uVar2 = uVar2 & 0xffe0 ^ 0x400;
      }
      else {
        uVar2 = uVar2 & 0xffe0 | uVar2 + 1 & 0x1f;
      }
      (pPVar1->vram_addr).super_Register<unsigned_short>.value_ = uVar2;
    }
    if (pPVar1->cycle == 0x101) {
      (pPVar1->vram_addr).super_Register<unsigned_short>.value_ =
           (pPVar1->temp_vram_addr).super_Register<unsigned_short>.value_ & 0x41f |
           (pPVar1->vram_addr).super_Register<unsigned_short>.value_ & 0xfbe0;
    }
    else if (pPVar1->cycle == 0x100) {
      PpuVram::increase_y(&pPVar1->vram_addr);
      return;
    }
  }
  return;
}

Assistant:

void Ppu::increase_scroll_counters() {
    if (!registers_->mask.is_rendering_enabled()) {
        return;
    }

    // During pixels 280 through 304 of this scanline, the vertical scroll bits
    // are reloaded if rendering is enabled. vert(v) == vert(t)
    if (scanline() == kPreRenderScanline) {
        if (cycle() >= 280 && cycle() <= 304) {
            auto addr = registers_->vram_addr.value();
            addr &= static_cast<uint16_t>(~0x7BE0u);
            addr |= (registers_->temp_vram_addr.value() & 0x7BE0u);
            registers_->vram_addr = PpuVram(addr);
        }
    }

    const bool should_increase_coarse_x =
            !(cycle() == 0 || (cycle() >= 256 && cycle() <= 320));
    if (should_increase_coarse_x && (cycle() % 8) == 0) {
        registers_->vram_addr.increase_coarse_x();
    }

    if (cycle() == 256) {
        registers_->vram_addr.increase_y();
    } else if (cycle() == 257) {
        // Copies all bits related to horizontal position from
        // temporal to current vram_address
        // From http://wiki.nesdev.com/w/index.php/PPU_scrolling
        // If rendering is enabled, the PPU copies all bits related to
        // horizontal position from t to v:
        auto addr = registers_->vram_addr.value();
        addr &= ~0x41Fu;
        addr |= registers_->temp_vram_addr.value() & 0x41Fu;
        registers_->vram_addr = PpuVram(addr);
    }
}